

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O1

void __thiscall trackerboy::Sequence::resize(Sequence *this,size_t size)

{
  invalid_argument *this_00;
  
  if (size < 0x101) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->mData,size);
    if (((this->mLoop).super__Optional_base<unsigned_char,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_char>._M_engaged == true) &&
       (size <= (this->mLoop).super__Optional_base<unsigned_char,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_char>._M_payload._M_value)) {
      (this->mLoop).super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged = false;
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"size must be less than or equal to 256");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Sequence::resize(size_t size) {
    if (size > MAX_SIZE) {
        throw std::invalid_argument("size must be less than or equal to 256");
    }
    mData.resize(size);
    if (mLoop && *mLoop >= size) {
        mLoop.reset();
    }
}